

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

QString * quotedStringLiteral(QString *__return_storage_ptr__,QString *value)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  long lVar3;
  Data *pDVar4;
  long lVar5;
  int iVar6;
  QChar QVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QArrayData *local_90 [3];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QStringBuilder<QLatin1String,_QString> local_60;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar9 = (uint)(value->d).size;
  iVar6 = -2;
  if (-2 < (int)((double)(int)uVar9 * 1.1)) {
    iVar6 = (int)((double)(int)uVar9 * 1.1);
  }
  QString::reallocData((longlong)__return_storage_ptr__,iVar6 + 2);
  pDVar4 = (__return_storage_ptr__->d).d;
  if ((pDVar4 != (Data *)0x0) && ((pDVar4->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar4->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  QVar7.ucs = (char16_t)__return_storage_ptr__;
  QString::append(QVar7);
  if (0 < (int)uVar9) {
    uVar8 = 0;
    do {
      cVar2 = (value->d).ptr[uVar8];
      switch(cVar2) {
      case L'\b':
        break;
      case L'\t':
        break;
      case L'\n':
        break;
      case L'\v':
      case L'\f':
switchD_00144dc5_caseD_b:
        if ((ushort)(cVar2 + L'￠') < 0x60) {
          QString::append(QVar7);
        }
        else {
          QString::number((int)local_90,(uint)(ushort)cVar2);
          QString::rightJustified((longlong)&local_78,(QChar)(char16_t)local_90,true);
          local_60.b.d.size = local_68;
          local_60.b.d.ptr = pcStack_70;
          local_60.b.d.d = (Data *)local_78;
          local_60.a.m_size = 2;
          local_60.a.m_data = "\\u";
          local_78 = (QArrayData *)0x0;
          pcStack_70 = (char16_t *)0x0;
          local_68 = 0;
          operator+=(__return_storage_ptr__,&local_60);
          if (&(local_60.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_60.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_60.b.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,0x10);
            }
          }
          if (local_90[0] != (QArrayData *)0x0) {
            LOCK();
            (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90[0],2,0x10);
            }
          }
        }
        goto LAB_00144e4e;
      case L'\r':
        break;
      default:
        if ((cVar2 != L'\"') && (cVar2 != L'\\')) goto switchD_00144dc5_caseD_b;
      }
      QVar10.m_data = (char *)0x2;
      QVar10.m_size = (qsizetype)__return_storage_ptr__;
      QString::append(QVar10);
LAB_00144e4e:
      uVar8 = uVar8 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar8);
  }
  QString::append(QVar7);
  pDVar4 = (__return_storage_ptr__->d).d;
  if (pDVar4 != (Data *)0x0) {
    lVar3 = (__return_storage_ptr__->d).size;
    if ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
       (lVar5 = (pDVar4->super_QArrayData).alloc, lVar3 < lVar5)) {
      QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)lVar3);
      pDVar4 = (__return_storage_ptr__->d).d;
      if (pDVar4 == (Data *)0x0) goto LAB_00144f90;
      lVar5 = (pDVar4->super_QArrayData).alloc;
    }
    if (lVar5 != 0) {
      pAVar1 = &(pDVar4->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
    }
  }
LAB_00144f90:
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString quotedStringLiteral(const QString &value)
{
    QString result;
    const int len = value.size();
    result.reserve(int(len * 1.1) + 2);

    result += QLatin1Char('"');

    // Escape
    for (int i = 0; i < len; ++i) {
        QChar character = value.at(i);
        ushort code = character.unicode();
        switch (code) {
        case '\\':
            result += QLatin1String("\\\\");
            break;
        case '"':
            result += QLatin1String("\\\"");
            break;
        case '\b':
            result += QLatin1String("\\b");
            break;
        case '\n':
            result += QLatin1String("\\n");
            break;
        case '\r':
            result += QLatin1String("\\r");
            break;
        case '\t':
            result += QLatin1String("\\t");
            break;
        default:
            if (code >= 32 && code <= 127)
                result += character;
            else
                result += QLatin1String("\\u") + QString::number(code, 16).rightJustified(4, '0');
        }
    }

    result += QLatin1Char('"');

    result.squeeze();
    return result;
}